

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall CharScanner::reportError(CharScanner *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  (**(code **)(*in_RDI + 0x60))();
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in ");
    psVar3 = (string *)(**(code **)(*in_RDI + 0x60))();
    poVar2 = std::operator<<(poVar2,psVar3);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CharScanner::reportError(const std::string& s)
{
	if (getFilename() == "")
		std::cerr << "Error: " << s << std::endl;
	else
		std::cerr << "Error in " << getFilename() << ": " << s << std::endl;
}